

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::LowerInclusiveBetweenOperator,false,false,true>
                (interval_t *adata,interval_t *bdata,interval_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  unsigned_long *puVar7;
  sel_t *psVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  
  if (count == 0) {
    lVar18 = 0;
  }
  else {
    psVar1 = result_sel->sel_vector;
    psVar2 = asel->sel_vector;
    psVar3 = bsel->sel_vector;
    psVar4 = csel->sel_vector;
    puVar5 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar6 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar7 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    psVar8 = false_sel->sel_vector;
    lVar18 = 0;
    uVar15 = 0;
    do {
      uVar13 = uVar15;
      if (psVar1 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar1[uVar15];
      }
      uVar17 = uVar15;
      if (psVar2 != (sel_t *)0x0) {
        uVar17 = (ulong)psVar2[uVar15];
      }
      uVar10 = uVar15;
      if (psVar3 != (sel_t *)0x0) {
        uVar10 = (ulong)psVar3[uVar15];
      }
      uVar16 = uVar15;
      if (psVar4 != (sel_t *)0x0) {
        uVar16 = (ulong)psVar4[uVar15];
      }
      if ((((puVar5 == (unsigned_long *)0x0) || ((puVar5[uVar17 >> 6] >> (uVar17 & 0x3f) & 1) != 0))
          && ((puVar6 == (unsigned_long *)0x0 || ((puVar6[uVar10 >> 6] >> (uVar10 & 0x3f) & 1) != 0)
              ))) &&
         ((puVar7 == (unsigned_long *)0x0 || ((puVar7[uVar16 >> 6] >> (uVar16 & 0x3f) & 1) != 0))))
      {
        lVar21._0_4_ = adata[uVar17].months;
        lVar21._4_4_ = adata[uVar17].days;
        lVar12._0_4_ = bdata[uVar10].months;
        lVar12._4_4_ = bdata[uVar10].days;
        lVar11 = (lVar12 >> 0x20) + bdata[uVar10].micros / 86400000000;
        lVar14 = lVar11 % 0x1e;
        lVar19 = (long)(int)(undefined4)lVar12 + lVar11 / 0x1e;
        lVar12 = (lVar21 >> 0x20) + adata[uVar17].micros / 86400000000;
        lVar11 = adata[uVar17].micros % 86400000000;
        lVar20 = lVar12 % 0x1e;
        lVar21 = (long)(int)(undefined4)lVar21 + lVar12 / 0x1e;
        uVar17 = 1;
        if (lVar19 <= lVar21) {
          lVar9._0_4_ = cdata[uVar16].months;
          lVar9._4_4_ = cdata[uVar16].days;
          if ((lVar19 < lVar21) ||
             ((lVar14 <= lVar20 &&
              ((lVar14 < lVar20 || (bdata[uVar10].micros % 86400000000 <= lVar11)))))) {
            lVar12 = (lVar9 >> 0x20) + cdata[uVar16].micros / 86400000000;
            lVar14 = lVar12 % 0x1e;
            lVar12 = (long)(int)(undefined4)lVar9 + lVar12 / 0x1e;
            if (lVar21 < lVar12) {
              uVar17 = 0;
            }
            else if (lVar21 <= lVar12) {
              if (lVar20 < lVar14) {
                uVar17 = 0;
              }
              else {
                uVar17 = (ulong)(cdata[uVar16].micros % 86400000000 <= lVar11 || lVar14 < lVar20);
              }
            }
          }
        }
      }
      else {
        uVar17 = 1;
      }
      psVar8[lVar18] = (sel_t)uVar13;
      lVar18 = uVar17 + lVar18;
      uVar15 = uVar15 + 1;
    } while (count != uVar15);
  }
  return count - lVar18;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}